

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

double matd_vec_dot_product(matd_t *a,matd_t *b)

{
  int iVar1;
  int local_2c;
  double dStack_28;
  int i;
  double acc;
  int bdim;
  int adim;
  matd_t *b_local;
  matd_t *a_local;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x387,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
  }
  if (b != (matd_t *)0x0) {
    iVar1 = matd_is_vector(a);
    if (iVar1 != 0) {
      iVar1 = matd_is_vector(b);
      if (iVar1 != 0) {
        iVar1 = a->ncols * a->nrows;
        if (iVar1 == b->ncols * b->nrows) {
          dStack_28 = 0.0;
          for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
            dStack_28 = (double)a[(long)local_2c + 1] * (double)b[(long)local_2c + 1] + dStack_28;
          }
          return dStack_28;
        }
        __assert_fail("adim == bdim",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x38c,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
      }
    }
    __assert_fail("matd_is_vector(a) && matd_is_vector(b)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x389,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
  }
  __assert_fail("b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x388,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
}

Assistant:

double matd_vec_dot_product(const matd_t *a, const matd_t *b)
{
    assert(a != NULL);
    assert(b != NULL);
    assert(matd_is_vector(a) && matd_is_vector(b));
    int adim = a->ncols*a->nrows;
    int bdim = b->ncols*b->nrows;
    assert(adim == bdim);

    double acc = 0;
    for (int i = 0; i < adim; i++) {
        acc += a->data[i] * b->data[i];
    }
    return acc;
}